

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutovg-ft-math.c
# Opt level: O0

PVG_FT_Long PVG_FT_MulDiv(PVG_FT_Long a,PVG_FT_Long b,PVG_FT_Long c)

{
  undefined8 local_40;
  undefined8 local_38;
  PVG_FT_Long d;
  long lStack_20;
  PVG_FT_Int s;
  PVG_FT_Long c_local;
  PVG_FT_Long b_local;
  PVG_FT_Long a_local;
  
  d._4_4_ = 1;
  b_local = a;
  if (a < 0) {
    b_local = -a;
    d._4_4_ = -1;
  }
  c_local = b;
  if (b < 0) {
    c_local = -b;
    d._4_4_ = -d._4_4_;
  }
  lStack_20 = c;
  if (c < 0) {
    lStack_20 = -c;
    d._4_4_ = -d._4_4_;
  }
  if (lStack_20 < 1) {
    local_38 = 0x7fffffff;
  }
  else {
    local_38 = (b_local * c_local + (lStack_20 >> 1)) / lStack_20;
  }
  if (d._4_4_ < 1) {
    local_40 = -local_38;
  }
  else {
    local_40 = local_38;
  }
  return local_40;
}

Assistant:

PVG_FT_Long PVG_FT_MulDiv(PVG_FT_Long a, PVG_FT_Long b, PVG_FT_Long c)
{
    PVG_FT_Int  s = 1;
    PVG_FT_Long d;

    PVG_FT_MOVE_SIGN(a, s);
    PVG_FT_MOVE_SIGN(b, s);
    PVG_FT_MOVE_SIGN(c, s);

    d = (PVG_FT_Long)(c > 0 ? ((PVG_FT_Int64)a * b + (c >> 1)) / c : 0x7FFFFFFFL);

    return (s > 0) ? d : -d;
}